

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O3

void __thiscall
asio::detail::strand_service::on_dispatch_exit::~on_dispatch_exit(on_dispatch_exit *this)

{
  scheduler_operation *psVar1;
  scheduler_operation *psVar2;
  scheduler_operation *psVar3;
  strand_impl *psVar4;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->impl_->mutex_);
  psVar4 = this->impl_;
  psVar1 = (psVar4->waiting_queue_).front_;
  if (psVar1 != (scheduler_operation *)0x0) {
    psVar2 = (psVar4->ready_queue_).back_;
    psVar3 = (scheduler_operation *)&psVar4->ready_queue_;
    if (psVar2 != (scheduler_operation *)0x0) {
      psVar3 = psVar2;
    }
    psVar3->next_ = psVar1;
    (psVar4->ready_queue_).back_ = (psVar4->waiting_queue_).back_;
    (psVar4->waiting_queue_).front_ = (scheduler_operation *)0x0;
    (psVar4->waiting_queue_).back_ = (scheduler_operation *)0x0;
    psVar4 = this->impl_;
  }
  psVar1 = (psVar4->ready_queue_).front_;
  psVar4->locked_ = psVar1 != (scheduler_operation *)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&psVar4->mutex_);
  if (psVar1 != (scheduler_operation *)0x0) {
    scheduler::post_immediate_completion(this->io_context_,&this->impl_->super_operation,false);
  }
  return;
}

Assistant:

~on_dispatch_exit()
  {
    impl_->mutex_.lock();
    impl_->ready_queue_.push(impl_->waiting_queue_);
    bool more_handlers = impl_->locked_ = !impl_->ready_queue_.empty();
    impl_->mutex_.unlock();

    if (more_handlers)
      io_context_->post_immediate_completion(impl_, false);
  }